

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O3

la_ssize_t archive_read_data(archive *_a,void *buff,size_t s)

{
  long lVar1;
  long lVar2;
  int iVar3;
  size_t __n;
  ulong uVar4;
  la_ssize_t lVar5;
  ulong __n_00;
  undefined1 auVar6 [16];
  void *read_buf;
  char *local_40;
  int64_t *local_38;
  
  if (s == 0) {
    lVar5 = 0;
  }
  else {
    local_38 = &_a->read_data_offset;
    lVar5 = 0;
    do {
      if (_a->read_data_remaining == 0) {
        local_40 = _a->read_data_block;
        _a->read_data_is_posix_read = '\x01';
        _a->read_data_requested = s;
        iVar3 = archive_read_data_block(_a,&local_40,&_a->read_data_remaining,local_38);
        _a->read_data_block = local_40;
        if (iVar3 == 1) {
          return lVar5;
        }
        if (iVar3 < 0) {
          return (long)iVar3;
        }
      }
      lVar1 = _a->read_data_offset;
      lVar2 = _a->read_data_output_offset;
      if (lVar1 < lVar2) {
        archive_set_error(_a,0x54,"Encountered out-of-order sparse blocks");
        return -10;
      }
      __n = lVar1 - lVar2;
      if (__n == 0 || lVar1 < lVar2) {
        __n = 0;
      }
      if ((long)(lVar2 + s) < lVar1) {
        __n = s;
      }
      memset(buff,0,__n);
      _a->read_data_output_offset = _a->read_data_output_offset + __n;
      lVar5 = lVar5 + __n;
      uVar4 = s - __n;
      if (uVar4 == 0) break;
      __n_00 = _a->read_data_remaining;
      if (uVar4 <= _a->read_data_remaining) {
        __n_00 = uVar4;
      }
      memcpy((void *)((long)buff + __n),_a->read_data_block,__n_00);
      _a->read_data_block = _a->read_data_block + __n_00;
      _a->read_data_remaining = _a->read_data_remaining - __n_00;
      buff = (void *)((long)((long)buff + __n) + __n_00);
      lVar5 = lVar5 + __n_00;
      auVar6._8_4_ = (int)__n_00;
      auVar6._0_8_ = __n_00;
      auVar6._12_4_ = (int)(__n_00 >> 0x20);
      _a->read_data_offset = __n_00 + _a->read_data_offset;
      _a->read_data_output_offset = auVar6._8_8_ + _a->read_data_output_offset;
      s = uVar4 - __n_00;
    } while (s != 0);
  }
  _a->read_data_is_posix_read = '\0';
  _a->read_data_requested = 0;
  return lVar5;
}

Assistant:

ssize_t
archive_read_data(struct archive *_a, void *buff, size_t s)
{
	struct archive *a = (struct archive *)_a;
	char	*dest;
	const void *read_buf;
	size_t	 bytes_read;
	size_t	 len;
	int	 r;

	bytes_read = 0;
	dest = (char *)buff;

	while (s > 0) {
		if (a->read_data_remaining == 0) {
			read_buf = a->read_data_block;
			a->read_data_is_posix_read = 1;
			a->read_data_requested = s;
			r = archive_read_data_block(a, &read_buf,
			    &a->read_data_remaining, &a->read_data_offset);
			a->read_data_block = read_buf;
			if (r == ARCHIVE_EOF)
				return (bytes_read);
			/*
			 * Error codes are all negative, so the status
			 * return here cannot be confused with a valid
			 * byte count.  (ARCHIVE_OK is zero.)
			 */
			if (r < ARCHIVE_OK)
				return (r);
		}

		if (a->read_data_offset < a->read_data_output_offset) {
			archive_set_error(a, ARCHIVE_ERRNO_FILE_FORMAT,
			    "Encountered out-of-order sparse blocks");
			return (ARCHIVE_RETRY);
		}

		/* Compute the amount of zero padding needed. */
		if (a->read_data_output_offset + (int64_t)s <
		    a->read_data_offset) {
			len = s;
		} else if (a->read_data_output_offset <
		    a->read_data_offset) {
			len = (size_t)(a->read_data_offset -
			    a->read_data_output_offset);
		} else
			len = 0;

		/* Add zeroes. */
		memset(dest, 0, len);
		s -= len;
		a->read_data_output_offset += len;
		dest += len;
		bytes_read += len;

		/* Copy data if there is any space left. */
		if (s > 0) {
			len = a->read_data_remaining;
			if (len > s)
				len = s;
			memcpy(dest, a->read_data_block, len);
			s -= len;
			a->read_data_block += len;
			a->read_data_remaining -= len;
			a->read_data_output_offset += len;
			a->read_data_offset += len;
			dest += len;
			bytes_read += len;
		}
	}
	a->read_data_is_posix_read = 0;
	a->read_data_requested = 0;
	return (bytes_read);
}